

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wapiti.c
# Opt level: O2

int main(int argc,char **argv)

{
  double dVar1;
  qrk_t *qrk;
  qrk_t *qrk_00;
  ushort *puVar2;
  byte bVar3;
  int iVar4;
  rdr_t *rdr;
  mdl_t *mdl;
  FILE *pFVar5;
  FILE *__stream;
  char *pcVar6;
  char *pcVar7;
  ushort **ppuVar8;
  uint64_t uVar9;
  uint64_t uVar10;
  uint64_t uVar11;
  double *pdVar12;
  dat_t *pdVar13;
  opt_t *poVar14;
  long lVar15;
  char *pcVar16;
  ulong uVar17;
  bool bVar18;
  anon_struct_16_2_f83984a8 *paVar19;
  uint32_t y;
  char **ppcVar20;
  uint64_t id;
  ulong uVar21;
  uint uVar22;
  double local_160;
  char *toks [4];
  opt_t opt;
  
  poVar14 = &opt;
  memcpy(poVar14,&opt_defaults,0xf0);
  opt_parse(argc,argv,poVar14);
  rdr = rdr_new(opt.maxent);
  mdl = mdl_new(rdr);
  mdl->opt = poVar14;
  switch(opt.mode) {
  case 0:
    iVar4 = strcmp(opt.type,"list");
    if (iVar4 == 0) {
      info("Available types of models:\n");
      for (lVar15 = 0; lVar15 != 0x18; lVar15 = lVar15 + 8) {
        info("\t%s\n",*(undefined8 *)((long)typ_lst + lVar15));
      }
LAB_0010eae6:
      exit(0);
    }
    iVar4 = strcmp(opt.algo,"list");
    if (iVar4 == 0) {
      info("Available training algorithms:\n");
      for (lVar15 = 0; lVar15 != 0x60; lVar15 = lVar15 + 0x10) {
        info("\t%s\n",*(undefined8 *)((long)&trn_lst[0].name + lVar15));
      }
      goto LAB_0010eae6;
    }
    ppcVar20 = typ_lst;
    lVar15 = 0;
    while( true ) {
      if (lVar15 == 3) {
        fatal("unknown model type \'%s\'",opt.type);
      }
      iVar4 = strcmp(opt.type,*ppcVar20);
      if (iVar4 == 0) break;
      lVar15 = lVar15 + 1;
      ppcVar20 = ppcVar20 + 1;
    }
    mdl->type = (uint32_t)lVar15;
    paVar19 = trn_lst;
    lVar15 = 0;
    while( true ) {
      if (lVar15 == 6) {
        fatal("unknown algorithm \'%s\'",opt.algo);
      }
      iVar4 = strcmp(opt.algo,paVar19->name);
      if (iVar4 == 0) break;
      lVar15 = lVar15 + 1;
      paVar19 = paVar19 + 1;
    }
    if (opt.model != (char *)0x0) {
      info("* Load previous model\n");
      pFVar5 = fopen(mdl->opt->model,"r");
      if (pFVar5 == (FILE *)0x0) {
        pfatal("cannot open input model file");
      }
      mdl_load(mdl,(FILE *)pFVar5);
      fclose(pFVar5);
      poVar14 = mdl->opt;
    }
    if (poVar14->pattern != (char *)0x0) {
      info("* Load patterns\n");
      pFVar5 = fopen(mdl->opt->pattern,"r");
      if (pFVar5 == (FILE *)0x0) {
        pfatal("cannot open pattern file");
      }
      rdr_loadpat(mdl->reader,(FILE *)pFVar5);
      fclose(pFVar5);
      qrk_lock(mdl->reader->obs,false);
    }
    info("* Load training data\n");
    pcVar7 = mdl->opt->input;
    pFVar5 = _stdin;
    if ((pcVar7 != (char *)0x0) && (pFVar5 = fopen(pcVar7,"r"), pFVar5 == (FILE *)0x0)) {
      pfatal("cannot open input data file");
      pFVar5 = (FILE *)0x0;
    }
    pdVar13 = rdr_readdat(mdl->reader,(FILE *)pFVar5,true);
    mdl->train = pdVar13;
    if (mdl->opt->input != (char *)0x0) {
      fclose(pFVar5);
    }
    qrk_lock(mdl->reader->lbl,true);
    qrk_lock(mdl->reader->obs,true);
    if ((mdl->train == (dat_t *)0x0) || (mdl->train->nseq == 0)) {
      fatal("no train data loaded");
    }
    if (mdl->opt->devel != (char *)0x0) {
      info("* Load development data\n");
      pFVar5 = fopen(mdl->opt->devel,"r");
      if (pFVar5 == (FILE *)0x0) {
        pfatal("cannot open development file");
      }
      pdVar13 = rdr_readdat(mdl->reader,(FILE *)pFVar5,true);
      mdl->devel = pdVar13;
      fclose(pFVar5);
    }
    pcVar7 = "* Resync the model\n";
    if (mdl->theta == (double *)0x0) {
      pcVar7 = "* Initialize the model\n";
    }
    info(pcVar7);
    mdl_sync(mdl);
    info("* Summary\n");
    info("    nb train:    %u\n",(ulong)mdl->train->nseq);
    if (mdl->devel != (dat_t *)0x0) {
      info("    nb devel:    %u\n",(ulong)mdl->devel->nseq);
    }
    info("    nb labels:   %u\n",(ulong)mdl->nlbl);
    info("    nb blocks:   %lu\n",mdl->nobs);
    info("    nb features: %lu\n",mdl->nftr);
    info("* Train the model with %s\n",mdl->opt->algo);
    uit_setup(mdl);
    (*trn_lst[lVar15].train)(mdl);
    uit_cleanup(mdl);
    poVar14 = mdl->opt;
    goto LAB_0010e995;
  case 1:
    if (opt.model == (char *)0x0) {
      fatal("you must specify a model");
    }
    info("* Load model\n");
    pFVar5 = fopen(mdl->opt->model,"r");
    if (pFVar5 == (FILE *)0x0) {
      pfatal("cannot open input model file");
    }
    mdl_load(mdl,(FILE *)pFVar5);
    fclose(pFVar5);
    pFVar5 = _stdout;
    pcVar7 = mdl->opt->input;
    __stream = _stdin;
    if ((pcVar7 != (char *)0x0) && (__stream = fopen(pcVar7,"r"), __stream == (FILE *)0x0)) {
      pfatal("cannot open input data file");
      __stream = (FILE *)0x0;
    }
    pcVar7 = mdl->opt->output;
    if ((pcVar7 != (char *)0x0) && (pFVar5 = fopen(pcVar7,"w"), pFVar5 == (FILE *)0x0)) {
      pFVar5 = (FILE *)0x0;
      pfatal("cannot open output data file");
    }
    info("* Label sequences\n");
    tag_label(mdl,(FILE *)__stream,(FILE *)pFVar5);
    info("* Done\n");
    poVar14 = mdl->opt;
    if (poVar14->input != (char *)0x0) {
      fclose(__stream);
      poVar14 = mdl->opt;
    }
    pcVar7 = poVar14->output;
    break;
  case 2:
    info("* Load model\n");
    pcVar7 = mdl->opt->input;
    pFVar5 = _stdin;
    if ((pcVar7 != (char *)0x0) && (pFVar5 = fopen(pcVar7,"r"), pFVar5 == (FILE *)0x0)) {
      pfatal("cannot open input data file");
      pFVar5 = (FILE *)0x0;
    }
    mdl_load(mdl,(FILE *)pFVar5);
    poVar14 = mdl->opt;
    if (poVar14->input != (char *)0x0) {
      fclose(pFVar5);
      poVar14 = mdl->opt;
    }
    pFVar5 = _stdout;
    if ((poVar14->output != (char *)0x0) &&
       (pFVar5 = fopen(poVar14->output,"w"), pFVar5 == (FILE *)0x0)) {
      pfatal("cannot open output data file");
      pFVar5 = (FILE *)0x0;
    }
    info("* Dump model\n");
    uVar22 = mdl->nlbl;
    uVar17 = (ulong)uVar22;
    uVar9 = mdl->nobs;
    qrk = mdl->reader->lbl;
    qrk_00 = mdl->reader->obs;
    sprintf((char *)toks,"%%.%df\n",(ulong)(uint)mdl->opt->prec);
    for (uVar10 = 0; uVar10 != uVar9; uVar10 = uVar10 + 1) {
      pcVar7 = qrk_id2str(qrk_00,uVar10);
      bVar3 = mdl->kind[uVar10];
      bVar18 = true;
      if ((bVar3 & 1) != 0) {
        uVar11 = mdl->uoff[uVar10];
        pdVar12 = mdl->theta;
        bVar18 = true;
        for (id = 0; uVar17 != id; id = id + 1) {
          if (((mdl->opt->all != false) || (dVar1 = pdVar12[uVar11 + id], dVar1 != 0.0)) ||
             (NAN(dVar1))) {
            pcVar16 = qrk_id2str(qrk,id);
            bVar18 = false;
            fprintf(pFVar5,"%s\t#\t%s\t",pcVar7,pcVar16);
            fprintf(pFVar5,(char *)toks,pdVar12[uVar11 + id]);
          }
        }
        bVar3 = mdl->kind[uVar10];
      }
      if ((bVar3 & 2) != 0) {
        uVar11 = mdl->boff[uVar10];
        pdVar12 = mdl->theta;
        for (uVar21 = 0; uVar22 * uVar22 != uVar21; uVar21 = uVar21 + 1) {
          if (((mdl->opt->all != false) || (dVar1 = pdVar12[uVar11 + uVar21], dVar1 != 0.0)) ||
             (NAN(dVar1))) {
            bVar18 = false;
            pcVar16 = qrk_id2str(qrk,(uVar21 & 0xffffffff) % uVar17);
            pcVar6 = qrk_id2str(qrk,(uVar21 & 0xffffffff) / uVar17);
            fprintf(pFVar5,"%s\t%s\t%s\t",pcVar7,pcVar6,pcVar16);
            fprintf(pFVar5,(char *)toks,pdVar12[uVar11 + uVar21]);
          }
        }
      }
      if (!bVar18) {
        fputc(10,pFVar5);
      }
    }
    pcVar7 = mdl->opt->output;
    break;
  case 3:
    info("* Load model\n");
    pcVar7 = mdl->opt->model;
    if (pcVar7 == (char *)0x0) {
      fatal("no model file provided");
    }
    pFVar5 = fopen(pcVar7,"r");
    if (pFVar5 == (FILE *)0x0) {
      pfatal("cannot open model file %s",mdl->opt->model);
    }
    mdl_load(mdl,(FILE *)pFVar5);
    fclose(pFVar5);
    info("* Update model\n");
    pcVar7 = mdl->opt->input;
    pFVar5 = _stdin;
    if ((pcVar7 != (char *)0x0) && (pFVar5 = fopen(pcVar7,"r"), pFVar5 == (FILE *)0x0)) {
      pfatal("cannot open update file");
      pFVar5 = (FILE *)0x0;
    }
    uVar22 = 0;
LAB_0010e562:
    do {
      iVar4 = feof(pFVar5);
      if ((iVar4 != 0) || (pcVar7 = rdr_readline((FILE *)pFVar5), pcVar7 == (char *)0x0))
      goto LAB_0010e73c;
      uVar22 = uVar22 + 1;
      ppuVar8 = __ctype_b_loc();
      lVar15 = 0;
      pcVar16 = pcVar7;
      while (lVar15 != 4) {
        puVar2 = *ppuVar8;
        pcVar16 = pcVar16 + -1;
        do {
          pcVar6 = pcVar16 + 1;
          pcVar16 = pcVar16 + 1;
        } while ((*(byte *)((long)puVar2 + (long)*pcVar6 * 2 + 1) & 0x20) != 0);
        if (*pcVar6 == '\0') {
LAB_0010e5d4:
          if ((int)lVar15 != 4) {
            if ((int)lVar15 != 0) {
              fatal("invalid line at %d",(ulong)uVar22);
            }
            free(pcVar7);
            goto LAB_0010e562;
          }
          break;
        }
        toks[lVar15] = pcVar16;
        lVar15 = lVar15 + 1;
        do {
          pcVar6 = pcVar16;
          if ((long)*pcVar6 == 0) goto LAB_0010e5d4;
          pcVar16 = pcVar6 + 1;
        } while ((*(byte *)((long)puVar2 + (long)*pcVar6 * 2 + 1) & 0x20) == 0);
        *pcVar6 = '\0';
      }
      uVar9 = qrk_str2id(mdl->reader->obs,toks[0]);
      pcVar16 = toks[1];
      if (uVar9 == 0xffffffffffffffff) {
        fatal("bad on observation on line %d",(ulong)uVar22);
      }
      if (((*toks[1] != '#') || (uVar10 = 0xffffffffffffffff, toks[1][1] != '\0')) &&
         (uVar10 = qrk_str2id(mdl->reader->lbl,toks[1]), uVar10 == 0xffffffffffffffff)) {
        fatal("bad label <%s> line %d",pcVar16,(ulong)uVar22);
      }
      pcVar16 = toks[2];
      uVar11 = qrk_str2id(mdl->reader->lbl,toks[2]);
      if (uVar11 == 0xffffffffffffffff) {
        fatal("bad label <%s> line %d",pcVar16,(ulong)uVar22);
      }
      local_160 = 0.0;
      iVar4 = __isoc99_sscanf(toks[3],"%lf",&local_160);
      if (iVar4 != 1) {
        fatal("bad weight on line %d",(ulong)uVar22);
      }
      if (uVar10 == 0xffffffffffffffff) {
        pdVar12 = mdl->theta + mdl->uoff[uVar9];
      }
      else {
        pdVar12 = mdl->theta + mdl->boff[uVar9] + uVar10 * mdl->nlbl;
      }
      pdVar12[uVar11] = local_160;
      free(pcVar7);
    } while( true );
  default:
    goto switchD_0010df31_default;
  }
  if (pcVar7 != (char *)0x0) {
    fclose(pFVar5);
  }
  goto switchD_0010df31_default;
LAB_0010e73c:
  poVar14 = mdl->opt;
  if (poVar14->input != (char *)0x0) {
    fclose(pFVar5);
    poVar14 = mdl->opt;
  }
LAB_0010e995:
  if (poVar14->compact == true) {
    uVar9 = mdl->nobs;
    uVar10 = mdl->nftr;
    info("* Compacting the model\n");
    mdl_compact(mdl);
    info("    %8lu observations removed\n",uVar9 - mdl->nobs);
    info("    %8lu features removed\n",uVar10 - mdl->nftr);
  }
  info("* Save the model\n");
  pcVar7 = mdl->opt->output;
  pFVar5 = _stdout;
  if ((pcVar7 != (char *)0x0) && (pFVar5 = fopen(pcVar7,"w"), pFVar5 == (FILE *)0x0)) {
    pfatal("cannot open output model");
    pFVar5 = (FILE *)0x0;
  }
  mdl_save(mdl,(FILE *)pFVar5);
  if (mdl->opt->output != (char *)0x0) {
    fclose(pFVar5);
  }
  info("* Done\n");
switchD_0010df31_default:
  mdl_free(mdl);
  return 0;
}

Assistant:

int main(int argc, char *argv[argc]) {
	// We first parse command line switchs
	opt_t opt = opt_defaults;
	opt_parse(argc, argv, &opt);
	// Next we prepare the model
	mdl_t *mdl = mdl_new(rdr_new(opt.maxent));
	mdl->opt = &opt;
	// And switch to requested mode
	switch (opt.mode) {
		case 0: dotrain(mdl); break;
		case 1: dolabel(mdl); break;
		case 2: dodump(mdl);  break;
		case 3: doupdt(mdl);  break;
	}
	// And cleanup
	mdl_free(mdl);
	return EXIT_SUCCESS;
}